

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void icetMatrixRotate(IceTDouble angle,IceTDouble x,IceTDouble y,IceTDouble z,IceTDouble *mat_out)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  
  dVar1 = (double)z * (double)z + (double)x * (double)x + (double)y * (double)y;
  if (dVar1 < 0.0) {
    dVar1 = sqrt(dVar1);
  }
  else {
    dVar1 = SQRT(dVar1);
  }
  dVar4 = (double)x / dVar1;
  dVar5 = (double)y / dVar1;
  dVar1 = (double)z / dVar1;
  dVar2 = cos((double)angle * 0.017453292519943295);
  dVar3 = sin((double)angle * 0.017453292519943295);
  dVar6 = 1.0 - dVar2;
  *mat_out = (IceTDouble)(dVar4 * dVar4 * dVar6 + dVar2);
  dVar8 = dVar4 * dVar5 * dVar6;
  mat_out[1] = (IceTDouble)(dVar8 + dVar1 * dVar3);
  dVar7 = dVar4 * dVar1 * dVar6;
  mat_out[2] = (IceTDouble)(dVar7 - dVar5 * dVar3);
  mat_out[3] = 0.0;
  mat_out[4] = (IceTDouble)(dVar8 - dVar1 * dVar3);
  mat_out[5] = (IceTDouble)(dVar5 * dVar5 * dVar6 + dVar2);
  dVar8 = dVar5 * dVar1 * dVar6;
  mat_out[6] = (IceTDouble)(dVar8 + dVar4 * dVar3);
  mat_out[7] = 0.0;
  mat_out[8] = (IceTDouble)(dVar7 + dVar5 * dVar3);
  mat_out[9] = (IceTDouble)(dVar8 - dVar4 * dVar3);
  mat_out[10] = (IceTDouble)(dVar1 * dVar1 * dVar6 + dVar2);
  mat_out[0xb] = 0.0;
  mat_out[0xc] = 0.0;
  mat_out[0xd] = 0.0;
  mat_out[0xe] = 0.0;
  mat_out[0xf] = 1.0;
  return;
}

Assistant:

ICET_EXPORT void icetMatrixRotate(IceTDouble angle,
                                  IceTDouble x, IceTDouble y, IceTDouble z,
                                  IceTDouble *mat_out)
{
    IceTDouble v[3];
    IceTDouble length;
    IceTDouble c;
    IceTDouble s;

    v[0] = x;  v[1] = y;  v[2] = z;
    length = sqrt(icetDot3(v, v));
    v[0] /= length;  v[1] /= length;  v[2] /= length;

    c = cos((M_PI/180.0)*angle);
    s = sin((M_PI/180.0)*angle);

    mat_out[ 0] = v[0]*v[0]*(1-c) + c;
    mat_out[ 1] = v[0]*v[1]*(1-c) + v[2]*s;
    mat_out[ 2] = v[0]*v[2]*(1-c) - v[1]*s;
    mat_out[ 3] = 0.0;

    mat_out[ 4] = v[0]*v[1]*(1-c) - v[2]*s;
    mat_out[ 5] = v[1]*v[1]*(1-c) + c;
    mat_out[ 6] = v[1]*v[2]*(1-c) + v[0]*s;
    mat_out[ 7] = 0.0;

    mat_out[ 8] = v[0]*v[2]*(1-c) + v[1]*s;
    mat_out[ 9] = v[1]*v[2]*(1-c) - v[0]*s;
    mat_out[10] = v[2]*v[2]*(1-c) + c;
    mat_out[11] = 0.0;

    mat_out[12] = 0.0;
    mat_out[13] = 0.0;
    mat_out[14] = 0.0;
    mat_out[15] = 1.0;
}